

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setSectorSize(Pager *pPager)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  
  if ((*(char *)(in_RDI + 0x10) == '\0') &&
     (uVar1 = sqlite3OsDeviceCharacteristics((sqlite3_file *)0x12952f), (uVar1 & 0x1000) == 0)) {
    iVar2 = sqlite3SectorSize((sqlite3_file *)pPager);
    *(int *)(in_RDI + 0xb8) = iVar2;
    return;
  }
  *(undefined4 *)(in_RDI + 0xb8) = 0x200;
  return;
}

Assistant:

static void setSectorSize(Pager *pPager){
  assert( isOpen(pPager->fd) || pPager->tempFile );

  if( pPager->tempFile
   || (sqlite3OsDeviceCharacteristics(pPager->fd) & 
              SQLITE_IOCAP_POWERSAFE_OVERWRITE)!=0
  ){
    /* Sector size doesn't matter for temporary files. Also, the file
    ** may not have been opened yet, in which case the OsSectorSize()
    ** call will segfault. */
    pPager->sectorSize = 512;
  }else{
    pPager->sectorSize = sqlite3SectorSize(pPager->fd);
  }
}